

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O2

int al_get_new_display_refresh_rate(void)

{
  int iVar1;
  thread_local_state *ptVar2;
  
  ptVar2 = tls_get();
  if (ptVar2 == (thread_local_state *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = ptVar2->new_display_refresh_rate;
  }
  return iVar1;
}

Assistant:

int al_get_new_display_refresh_rate(void)
{
   thread_local_state *tls;

   if ((tls = tls_get()) == NULL)
      return 0;
   return tls->new_display_refresh_rate;
}